

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_list::erase_peers
          (peer_list *this,torrent_state *state,erase_peer_flags_t flags)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  long lVar4;
  int *piVar5;
  value_type *pptVar6;
  bool local_125;
  iterator local_118;
  _Self local_f8;
  undefined1 local_d3;
  uchar local_d2;
  bitfield_flag local_d1;
  iterator local_d0;
  _Self local_b0;
  iterator local_90;
  _Self local_70;
  int local_4c;
  torrent_peer *ptStack_48;
  int current;
  torrent_peer *pe;
  int local_38;
  int local_34;
  int iterations;
  int low_watermark;
  int round_robin;
  int force_erase_candidate;
  int erase_candidate;
  int max_peerlist_size;
  torrent_state *state_local;
  peer_list *this_local;
  erase_peer_flags_t flags_local;
  
  force_erase_candidate = state->max_peerlist_size;
  if ((force_erase_candidate != 0) &&
     (_erase_candidate = state, state_local = (torrent_state *)this, this_local._7_1_ = flags.m_val,
     bVar2 = ::std::
             deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ::empty((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      *)this), !bVar2)) {
    round_robin = -1;
    low_watermark = -1;
    if (*(int *)&this->field_0x60 < 0 != (bool)(_erase_candidate->is_finished & 1U)) {
      recalculate_connect_candidates(this,_erase_candidate);
    }
    sVar3 = ::std::
            deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    *)this);
    lVar4 = random((aux *)(ulong)((int)sVar3 - 1));
    iterations = numeric_cast<int,unsigned_int,void>((uint)lVar4);
    local_34 = (force_erase_candidate * 0x5f) / 100;
    if (local_34 == force_erase_candidate) {
      local_34 = local_34 + -1;
    }
    sVar3 = ::std::
            deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    *)this);
    pe._4_4_ = (undefined4)sVar3;
    pe._0_4_ = 300;
    piVar5 = ::std::min<int>((int *)((long)&pe + 4),(int *)&pe);
    local_38 = *piVar5;
    while ((0 < local_38 &&
           (sVar3 = ::std::
                    deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            *)this), iVar1 = iterations, local_34 <= (int)sVar3))) {
      sVar3 = ::std::
              deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      *)this);
      if (iVar1 == (int)sVar3) {
        iterations = 0;
      }
      pptVar6 = container_wrapper<libtorrent::aux::torrent_peer_*,_long,_std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
                ::operator[](&this->m_peers,(long)iterations);
      ptStack_48 = *pptVar6;
      local_4c = iterations;
      bVar2 = is_erase_candidate(this,ptStack_48);
      if (bVar2) {
        if (round_robin != -1) {
          pptVar6 = container_wrapper<libtorrent::aux::torrent_peer_*,_long,_std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
                    ::operator[](&this->m_peers,(long)round_robin);
          bVar2 = anon_unknown.dwarf_84ea70::compare_peer_erase(*pptVar6,ptStack_48);
          if (bVar2) goto LAB_004f8fab;
        }
        bVar2 = should_erase_immediately(this,ptStack_48);
        if (!bVar2) {
          round_robin = local_4c;
          goto LAB_004f8fab;
        }
        if (local_4c < round_robin) {
          round_robin = round_robin + -1;
        }
        if (local_4c < low_watermark) {
          low_watermark = low_watermark + -1;
        }
        ::std::
        deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
        begin(&local_90,
              (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               *)this);
        ::std::operator+(&local_70,&local_90,(long)local_4c);
        erase_peer(this,&local_70,_erase_candidate);
      }
      else {
LAB_004f8fab:
        bVar2 = is_force_erase_candidate(this,ptStack_48);
        if (bVar2) {
          if (low_watermark != -1) {
            pptVar6 = container_wrapper<libtorrent::aux::torrent_peer_*,_long,_std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
                      ::operator[](&this->m_peers,(long)low_watermark);
            bVar2 = anon_unknown.dwarf_84ea70::compare_peer_erase(*pptVar6,ptStack_48);
            if (bVar2) goto LAB_004f8fed;
          }
          low_watermark = local_4c;
        }
LAB_004f8fed:
        iterations = iterations + 1;
      }
      local_38 = local_38 + -1;
    }
    if (round_robin < 0) {
      local_d2 = this_local._7_1_;
      local_d3 = 2;
      local_d1 = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::aux::erase_peer_flags_tag,_void>
                             )this_local._7_1_,
                            (bitfield_flag<unsigned_char,_libtorrent::aux::erase_peer_flags_tag,_void>
                             )0x2);
      local_125 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_d1);
      local_125 = local_125 && (uint)low_watermark < 0x80000000;
      if (local_125) {
        ::std::
        deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
        begin(&local_118,
              (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               *)this);
        ::std::operator+(&local_f8,&local_118,(long)low_watermark);
        erase_peer(this,&local_f8,_erase_candidate);
      }
    }
    else {
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      begin(&local_d0,
            (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)this);
      ::std::operator+(&local_b0,&local_d0,(long)round_robin);
      erase_peer(this,&local_b0,_erase_candidate);
    }
  }
  return;
}

Assistant:

void peer_list::erase_peers(torrent_state* state, erase_peer_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		int max_peerlist_size = state->max_peerlist_size;

		if (max_peerlist_size == 0 || m_peers.empty()) return;

		int erase_candidate = -1;
		int force_erase_candidate = -1;

		if (bool(m_finished) != state->is_finished)
			recalculate_connect_candidates(state);

		int round_robin = aux::numeric_cast<int>(random(std::uint32_t(m_peers.size() - 1)));

		int low_watermark = max_peerlist_size * 95 / 100;
		if (low_watermark == max_peerlist_size) --low_watermark;

		for (int iterations = std::min(int(m_peers.size()), 300);
			iterations > 0; --iterations)
		{
			if (int(m_peers.size()) < low_watermark)
				break;

			if (round_robin == int(m_peers.size())) round_robin = 0;

			torrent_peer& pe = *m_peers[round_robin];
			TORRENT_ASSERT(pe.in_use);
			int const current = round_robin;

			if (is_erase_candidate(pe)
				&& (erase_candidate == -1
					|| !compare_peer_erase(*m_peers[erase_candidate], pe)))
			{
				if (should_erase_immediately(pe))
				{
					if (erase_candidate > current) --erase_candidate;
					if (force_erase_candidate > current) --force_erase_candidate;
					TORRENT_ASSERT(current >= 0 && current < int(m_peers.size()));
					erase_peer(m_peers.begin() + current, state);
					continue;
				}
				else
				{
					erase_candidate = current;
				}
			}
			if (is_force_erase_candidate(pe)
				&& (force_erase_candidate == -1
					|| !compare_peer_erase(*m_peers[force_erase_candidate], pe)))
			{
				force_erase_candidate = current;
			}

			++round_robin;
		}

		if (erase_candidate > -1)
		{
			TORRENT_ASSERT(erase_candidate >= 0 && erase_candidate < int(m_peers.size()));
			erase_peer(m_peers.begin() + erase_candidate, state);
		}
		else if ((flags & force_erase) && force_erase_candidate > -1)
		{
			TORRENT_ASSERT(force_erase_candidate >= 0 && force_erase_candidate < int(m_peers.size()));
			erase_peer(m_peers.begin() + force_erase_candidate, state);
		}
	}